

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__cleanup_jpeg(stbi__jpeg *j)

{
  long *in_RDI;
  int i;
  int local_c;
  
  for (local_c = 0; local_c < *(int *)(*in_RDI + 8); local_c = local_c + 1) {
    if (in_RDI[(long)local_c * 0xc + 0x8bb] != 0) {
      free((void *)in_RDI[(long)local_c * 0xc + 0x8bb]);
      in_RDI[(long)local_c * 0xc + 0x8bb] = 0;
      in_RDI[(long)local_c * 0xc + 0x8ba] = 0;
    }
    if (in_RDI[(long)local_c * 0xc + 0x8bc] != 0) {
      free((void *)in_RDI[(long)local_c * 0xc + 0x8bc]);
      in_RDI[(long)local_c * 0xc + 0x8bc] = 0;
      in_RDI[(long)local_c * 0xc + 0x8be] = 0;
    }
    if (in_RDI[(long)local_c * 0xc + 0x8bd] != 0) {
      free((void *)in_RDI[(long)local_c * 0xc + 0x8bd]);
      in_RDI[(long)local_c * 0xc + 0x8bd] = 0;
    }
  }
  return;
}

Assistant:

static void stbi__cleanup_jpeg(stbi__jpeg *j)
{
   int i;
   for (i=0; i < j->s->img_n; ++i) {
      if (j->img_comp[i].raw_data) {
         STBI_FREE(j->img_comp[i].raw_data);
         j->img_comp[i].raw_data = NULL;
         j->img_comp[i].data = NULL;
      }
      if (j->img_comp[i].raw_coeff) {
         STBI_FREE(j->img_comp[i].raw_coeff);
         j->img_comp[i].raw_coeff = 0;
         j->img_comp[i].coeff = 0;
      }
      if (j->img_comp[i].linebuf) {
         STBI_FREE(j->img_comp[i].linebuf);
         j->img_comp[i].linebuf = NULL;
      }
   }
}